

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  size_t sVar2;
  uint *puVar3;
  undefined1 local_90 [8];
  stack<int,_std::deque<int,_std::allocator<int>_>_> s1;
  int n;
  char local_29;
  undefined1 local_28 [7];
  char c;
  stack<int> s;
  
  s.mSize._4_4_ = 0;
  CP::stack<int>::stack((stack<int> *)local_28);
  __isoc99_scanf("%c",&local_29);
  while (local_29 != 'q') {
    if (((local_29 == 'a') || (local_29 == 'm')) || (local_29 == 'r')) {
      __isoc99_scanf("%d",&s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node);
      if (local_29 == 'a') {
        CP::stack<int>::push
                  ((stack<int> *)local_28,
                   (int *)&s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node);
      }
      else if (local_29 == 'm') {
        CP::stack<int>::multi_pop
                  ((stack<int> *)local_28,
                   (long)(int)s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node);
      }
      else if (local_29 == 'r') {
        CP::stack<int>::remove_top
                  ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_90,
                   (stack<int> *)local_28,
                   (long)(int)s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node);
        sVar2 = CP::stack<int>::size((stack<int> *)local_28);
        printf("remove_top Result: Size = %d Data =",sVar2 & 0xffffffff);
        while (bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                                 ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_90),
              !bVar1) {
          puVar3 = (uint *)std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                                     ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_90
                                     );
          printf(" %d",(ulong)*puVar3);
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_90);
        }
        printf("\n");
        std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
                  ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_90);
      }
    }
    else if (local_29 == 'd') {
      CP::stack<int>::pop((stack<int> *)local_28);
    }
    else if (local_29 == 'p') {
      CP::stack<int>::print((stack<int> *)local_28);
    }
    __isoc99_scanf("%c",&local_29);
  }
  s.mSize._4_4_ = 0;
  CP::stack<int>::~stack((stack<int> *)local_28);
  return s.mSize._4_4_;
}

Assistant:

int main() {
  CP::stack<int> s;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a' || c == 'm' || c == 'r') {
      // add data
      int n;
      scanf("%d", &n);
      if (c == 'a') {
        s.push(n);
      } else if (c == 'm') {
        s.multi_pop(n);
      } else if (c == 'r') {
        auto s1 = s.remove_top(n);
        printf("remove_top Result: Size = %d Data =",(int)s.size());
        while (s1.empty() == false) {
          printf(" %d",s1.top()); s1.pop();
        }
        printf("\n");
      }
    } else if (c == 'd') {
       s.pop();
    } else if (c == 'p') {
      s.print();
    }
    scanf("%c", &c);
  }
  return 0;
}